

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateConstexprString
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *structName)

{
  bool bVar1;
  char *__rhs;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::operator==(structName,"VkBaseInStructure");
  if ((!bVar1) && (bVar1 = std::operator==(structName,"VkBaseOutStructure"), !bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"VULKAN_HPP_CONSTEXPR",&local_39);
    bVar1 = containsUnion(this,structName);
    if ((bVar1) || (bVar1 = containsArray(this,structName), bVar1)) {
      __rhs = "_14 ";
    }
    else {
      __rhs = " ";
    }
    std::operator+(__return_storage_ptr__,&local_38,__rhs);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateConstexprString( std::string const & structName ) const
{
  // structs with a VkBaseInStructure and VkBaseOutStructure can't be a constexpr!
  const bool isConstExpression = ( structName != "VkBaseInStructure" ) && ( structName != "VkBaseOutStructure" );
  return isConstExpression ? ( std::string( "VULKAN_HPP_CONSTEXPR" ) + ( ( containsUnion( structName ) || containsArray( structName ) ) ? "_14 " : " " ) ) : "";
}